

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int CMinternal_listen(CManager_conflict cm,attr_list listen_info,int try_others)

{
  transport_entry p_Var1;
  atom_t aVar2;
  long lVar3;
  int iVar4;
  __pid_t _Var5;
  attr_list p_Var6;
  pthread_t pVar7;
  attr_list p_Var8;
  char *pcVar9;
  attr_list *pp_Var10;
  FILE *pFVar11;
  int iVar12;
  transport_entry_conflict *pp_Var13;
  long lVar14;
  char *chosen_transport;
  char *iface;
  timespec ts;
  
  chosen_transport = (char *)0x0;
  iface = (char *)0x0;
  iVar12 = 0;
  if (listen_info == (attr_list)0x0) {
    p_Var6 = (attr_list)0x0;
  }
  else {
    p_Var6 = (attr_list)attr_copy_list(listen_info);
    p_Var6 = split_transport_attributes(p_Var6);
    get_string_attr(p_Var6,CM_TRANSPORT,&chosen_transport);
    get_string_attr(p_Var6,CM_IP_INTERFACE,&iface);
    if (chosen_transport != (char *)0x0) {
      iVar4 = CMtrace_val[2];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMConnectionVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar11 = (FILE *)cm->CMTrace_file;
          _Var5 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar11,"P%lxT%lx - ",(long)_Var5,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"CM - Listening only on transport \"%s\"\n",
                chosen_transport);
      }
      fflush((FILE *)cm->CMTrace_file);
      iVar4 = load_transport(cm,chosen_transport,1);
      if (iVar4 == 0) {
        iVar4 = CMtrace_val[2];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(cm,CMConnectionVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar11 = (FILE *)cm->CMTrace_file;
            _Var5 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar11,"P%lxT%lx - ",(long)_Var5,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                  chosen_transport);
        }
        fflush((FILE *)cm->CMTrace_file);
        iVar4 = CMtrace_val[5];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(cm,CMTransportVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar11 = (FILE *)cm->CMTrace_file;
            _Var5 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar11,"P%lxT%lx - ",(long)_Var5,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"Failed to load transport \"%s\".  Revert to default.\n",
                  chosen_transport);
        }
        fflush((FILE *)cm->CMTrace_file);
        if (try_others == 0) {
          iVar12 = 0;
          goto LAB_00117c6a;
        }
        chosen_transport = (char *)0x0;
      }
    }
  }
  for (pp_Var13 = cm->transports;
      (pp_Var13 != (transport_entry_conflict *)0x0 &&
      (p_Var1 = *pp_Var13, p_Var1 != (transport_entry)0x0)); pp_Var13 = pp_Var13 + 1) {
    if ((chosen_transport == (char *)0x0) ||
       (iVar4 = strcmp(p_Var1->trans_name,chosen_transport), iVar4 == 0)) {
      p_Var8 = (*p_Var1->listen)(cm,&CMstatic_trans_svcs,p_Var1,p_Var6);
      add_attr(p_Var8,CM_CMANAGER_ID,1,(long)cm->CManager_ID);
      aVar2 = CM_IP_INTERFACE;
      if (iface != (char *)0x0) {
        pcVar9 = strdup(iface);
        add_string_attr(p_Var8,aVar2,pcVar9);
      }
      pp_Var10 = cm->contact_lists;
      if (pp_Var10 == (attr_list *)0x0) {
        pp_Var10 = (attr_list *)INT_CMmalloc(0x10);
        lVar14 = 0;
      }
      else {
        lVar3 = 0;
        do {
          lVar14 = lVar3;
          lVar3 = lVar14 + 1;
        } while (pp_Var10[lVar14] != (attr_list)0x0);
        pp_Var10 = (attr_list *)INT_CMrealloc(pp_Var10,lVar14 * 8 + 0x10U & 0x7fffffff8);
      }
      cm->contact_lists = pp_Var10;
      pp_Var10[lVar14] = p_Var8;
      cm->contact_lists[lVar14 + 1] = (attr_list)0x0;
      pFVar11 = (FILE *)cm->CMTrace_file;
      if (pFVar11 == (FILE *)0x0) {
        iVar4 = CMtrace_init(cm,CMConnectionVerbose);
        if (iVar4 != 0) {
          pFVar11 = (FILE *)cm->CMTrace_file;
          goto LAB_00117c37;
        }
      }
      else if (CMtrace_val[2] != 0) {
LAB_00117c37:
        fwrite("Adding contact list -> ",0x17,1,pFVar11);
        fdump_attr_list(cm->CMTrace_file,p_Var8);
      }
      iVar12 = (iVar12 + 1) - (uint)(p_Var8 == (attr_list)0x0);
    }
  }
LAB_00117c6a:
  if (p_Var6 != (attr_list)0x0) {
    free_attr_list(p_Var6);
  }
  return iVar12;
}

Assistant:

extern int
CMinternal_listen(CManager cm, attr_list listen_info, int try_others)
{
    int success = 0;
    transport_entry *trans_list;
    char *chosen_transport = NULL;
    char *iface = NULL;

    if (listen_info) {
        listen_info = split_transport_attributes(attr_copy_list(listen_info));
	get_string_attr(listen_info, CM_TRANSPORT, &chosen_transport);
	get_string_attr(listen_info, CM_IP_INTERFACE, &iface);
    }
    if (chosen_transport != NULL) {
        CMtrace_out(cm, CMConnectionVerbose,
		    "CM - Listening only on transport \"%s\"\n",
		    chosen_transport);
	if (load_transport(cm, chosen_transport, 1) == 0) {
	    CMtrace_out(cm, CMConnectionVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
					chosen_transport);
	    CMtrace_out(cm, CMTransportVerbose,
			"Failed to load transport \"%s\".  Revert to default.\n",
			chosen_transport);
	    if (!try_others) {
		if (listen_info) free_attr_list(listen_info);
		return success;
	    }
	    chosen_transport = NULL;
	}
    }
    trans_list = cm->transports;
    while ((trans_list != NULL) && (*trans_list != NULL)) {
	attr_list attrs;
	if ((chosen_transport == NULL) || 
	    (strcmp((*trans_list)->trans_name, chosen_transport) == 0)) {
	    attrs = (*trans_list)->listen(cm, &CMstatic_trans_svcs,
					  *trans_list,
					  listen_info);
	    add_attr(attrs, CM_CMANAGER_ID, Attr_Int4, (intptr_t)cm->CManager_ID);
	    if (iface) {
		add_string_attr(attrs, CM_IP_INTERFACE, strdup(iface));
	    }
	    add_contact_list(cm, attrs);
	    if (CMtrace_on(cm, CMConnectionVerbose)) {
		fprintf(cm->CMTrace_file, "Adding contact list -> ");
		fdump_attr_list(cm->CMTrace_file, attrs);
	    }
	    if (attrs != NULL) {
		success++;
	    }
	}
	trans_list++;
    }
    if (listen_info) free_attr_list(listen_info);
    return success;
}